

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

IncorrectConstruction *
CLI::IncorrectConstruction::Set0Opt(IncorrectConstruction *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,name,": Cannot set 0 expected, use a flag instead");
  IncorrectConstruction(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static IncorrectConstruction Set0Opt(std::string name) {
        return IncorrectConstruction(name + ": Cannot set 0 expected, use a flag instead");
    }